

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

size_t __thiscall caffe::LRNParameter::ByteSizeLong(LRNParameter *this)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      if (this->norm_region_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar5 = this->norm_region_ | 1;
        iVar3 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar4 = sVar4 + uVar6;
    }
    if ((uVar1 & 2) != 0) {
      if (this->engine_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar5 = this->engine_ | 1;
        iVar3 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar4 = sVar4 + uVar6;
    }
    if ((uVar1 & 4) != 0) {
      uVar5 = this->local_size_ | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    sVar7 = sVar4 + 5;
    if ((uVar1 & 8) == 0) {
      sVar7 = sVar4;
    }
    sVar8 = sVar7 + 5;
    if ((uVar1 & 0x10) == 0) {
      sVar8 = sVar7;
    }
    sVar4 = sVar8 + 5;
    if ((uVar1 & 0x20) == 0) {
      sVar4 = sVar8;
    }
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t LRNParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.LRNParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 63u) {
    // optional .caffe.LRNParameter.NormRegion norm_region = 4 [default = ACROSS_CHANNELS];
    if (has_norm_region()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->norm_region());
    }

    // optional .caffe.LRNParameter.Engine engine = 6 [default = DEFAULT];
    if (has_engine()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->engine());
    }

    // optional uint32 local_size = 1 [default = 5];
    if (has_local_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->local_size());
    }

    // optional float alpha = 2 [default = 1];
    if (has_alpha()) {
      total_size += 1 + 4;
    }

    // optional float beta = 3 [default = 0.75];
    if (has_beta()) {
      total_size += 1 + 4;
    }

    // optional float k = 5 [default = 1];
    if (has_k()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}